

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_decoder.c
# Opt level: O2

aom_codec_err_t
aom_codec_peek_stream_info
          (aom_codec_iface_t *iface,uint8_t *data,size_t data_sz,aom_codec_stream_info_t *si)

{
  aom_codec_err_t aVar1;
  
  if ((si != (aom_codec_stream_info_t *)0x0 && data_sz != 0) &&
      (data != (uint8_t *)0x0 && iface != (aom_codec_iface_t *)0x0)) {
    si->w = 0;
    si->h = 0;
    aVar1 = (*(iface->dec).peek_si)(data,data_sz,si);
    return aVar1;
  }
  return AOM_CODEC_INVALID_PARAM;
}

Assistant:

aom_codec_err_t aom_codec_peek_stream_info(aom_codec_iface_t *iface,
                                           const uint8_t *data, size_t data_sz,
                                           aom_codec_stream_info_t *si) {
  aom_codec_err_t res;

  if (!iface || !data || !data_sz || !si) {
    res = AOM_CODEC_INVALID_PARAM;
  } else {
    /* Set default/unknown values */
    si->w = 0;
    si->h = 0;

    res = iface->dec.peek_si(data, data_sz, si);
  }

  return res;
}